

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint32_t mipsdsp_rnd32_rashift(uint32_t a,uint8_t s)

{
  long lVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,s) == 0) {
    lVar1 = (ulong)a * 2;
  }
  else {
    lVar1 = (long)(int)a >> (s - 1 & 0x3f);
  }
  return (uint32_t)(lVar1 + 1U >> 1);
}

Assistant:

static inline uint32_t mipsdsp_rnd32_rashift(uint32_t a, uint8_t s)
{
    int64_t temp;

    if (s == 0) {
        temp = (uint64_t)a << 1;
    } else {
        temp = (int64_t)(int32_t)a >> (s - 1);
    }
    temp += 1;

    return (temp >> 1) & 0xFFFFFFFFull;
}